

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderReturnTests.cpp
# Opt level: O0

ShaderEvalFunc vkt::sr::anon_unknown_0::getEvalFunc(ReturnMode mode)

{
  code *pcStack_10;
  ReturnMode mode_local;
  
  if (mode == RETURNMODE_ALWAYS) {
    pcStack_10 = evalReturnAlways;
  }
  else if (mode == RETURNMODE_NEVER) {
    pcStack_10 = evalReturnNever;
  }
  else if (mode == RETURNMODE_DYNAMIC) {
    pcStack_10 = evalReturnDynamic;
  }
  else {
    pcStack_10 = (ShaderEvalFunc)0x0;
  }
  return pcStack_10;
}

Assistant:

static ShaderEvalFunc getEvalFunc (ReturnMode mode)
{
	switch (mode)
	{
		case RETURNMODE_ALWAYS:		return evalReturnAlways;
		case RETURNMODE_NEVER:		return evalReturnNever;
		case RETURNMODE_DYNAMIC:	return evalReturnDynamic;
		default:
			DE_ASSERT(DE_FALSE);
			return (ShaderEvalFunc)DE_NULL;
	}
}